

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::read_pixel
          (Image *this,ssize_t x,ssize_t y,uint64_t *r,uint64_t *g,uint64_t *b,uint64_t *a)

{
  bool bVar1;
  logic_error *this_00;
  ulong uVar2;
  long lVar3;
  Image *pIVar4;
  code *pcVar5;
  undefined *puVar6;
  byte bVar7;
  
  if ((((y | x) < 0) || (this->width <= x)) || (this->height <= y)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range((out_of_range *)this_00,"out of bounds");
    puVar6 = &::std::out_of_range::typeinfo;
    pcVar5 = ::std::out_of_range::~out_of_range;
    goto LAB_00110253;
  }
  bVar7 = this->channel_width << 5 | (byte)(this->channel_width - 8) >> 3;
  if (7 < bVar7) {
switchD_001100e3_caseD_2:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"image channel width is not 8, 16, 32, or 64");
    puVar6 = &::std::logic_error::typeinfo;
    pcVar5 = ::std::logic_error::~logic_error;
LAB_00110253:
    __cxa_throw(this_00,puVar6,pcVar5);
  }
  bVar1 = this->has_alpha;
  lVar3 = ((ulong)bVar1 + 3) * (this->width * y + x);
  switch(bVar7) {
  case 0:
    if (r != (uint64_t *)0x0) {
      *r = (ulong)*(byte *)((long)(this->data).raw + lVar3);
    }
    if (g != (uint64_t *)0x0) {
      *g = (ulong)*(byte *)((long)(this->data).raw + lVar3 + 1);
    }
    if (b != (uint64_t *)0x0) {
      *b = (ulong)*(byte *)((long)(this->data).raw + lVar3 + 2);
    }
    if (a == (uint64_t *)0x0) {
      return;
    }
    if (bVar1 != false) {
      uVar2 = (ulong)*(byte *)((long)(this->data).raw + lVar3 + 3);
      goto LAB_00110220;
    }
    break;
  case 1:
    if (r != (uint64_t *)0x0) {
      *r = (ulong)*(ushort *)((long)(this->data).raw + lVar3 * 2);
    }
    if (g != (uint64_t *)0x0) {
      *g = (ulong)*(ushort *)((long)(this->data).raw + lVar3 * 2 + 2);
    }
    if (b != (uint64_t *)0x0) {
      *b = (ulong)*(ushort *)((long)(this->data).raw + lVar3 * 2 + 4);
    }
    if (a == (uint64_t *)0x0) {
      return;
    }
    if (bVar1 != false) {
      uVar2 = (ulong)*(ushort *)((long)(this->data).raw + lVar3 * 2 + 6);
      goto LAB_00110220;
    }
    break;
  default:
    goto switchD_001100e3_caseD_2;
  case 3:
    if (r != (uint64_t *)0x0) {
      *r = (ulong)*(uint *)((long)(this->data).raw + lVar3 * 4);
    }
    if (g != (uint64_t *)0x0) {
      *g = (ulong)*(uint *)((long)(this->data).raw + lVar3 * 4 + 4);
    }
    if (b != (uint64_t *)0x0) {
      *b = (ulong)*(uint *)((long)(this->data).raw + lVar3 * 4 + 8);
    }
    if (a == (uint64_t *)0x0) {
      return;
    }
    if (bVar1 != false) {
      uVar2 = (ulong)*(uint *)((long)(this->data).raw + lVar3 * 4 + 0xc);
      goto LAB_00110220;
    }
    break;
  case 7:
    if (r != (uint64_t *)0x0) {
      *r = *(uint64_t *)((long)(this->data).raw + lVar3 * 8);
    }
    if (g != (uint64_t *)0x0) {
      *g = *(uint64_t *)((long)(this->data).raw + lVar3 * 8 + 8);
    }
    if (b != (uint64_t *)0x0) {
      *b = *(uint64_t *)((long)(this->data).raw + lVar3 * 8 + 0x10);
    }
    if (a == (uint64_t *)0x0) {
      return;
    }
    pIVar4 = (Image *)(lVar3 * 8 + (long)(this->data).raw);
    if (bVar1 == false) {
      pIVar4 = this;
    }
    uVar2 = pIVar4->max_value;
    goto LAB_00110220;
  }
  uVar2 = this->max_value;
LAB_00110220:
  *a = uVar2;
  return;
}

Assistant:

void Image::read_pixel(ssize_t x, ssize_t y, uint64_t* r, uint64_t* g,
    uint64_t* b, uint64_t* a) const {

  // check coordinates
  if (x < 0 || y < 0 || x >= this->width || y >= this->height) {
    throw out_of_range("out of bounds");
  }

  size_t index = (y * this->width + x) * (this->has_alpha ? 4 : 3);
  if (this->channel_width == 8) {
    if (r) {
      *r = this->data.as8[index];
    }
    if (g) {
      *g = this->data.as8[index + 1];
    }
    if (b) {
      *b = this->data.as8[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as8[index + 3] : this->max_value;
    }
  } else if (this->channel_width == 16) {
    if (r) {
      *r = this->data.as16[index];
    }
    if (g) {
      *g = this->data.as16[index + 1];
    }
    if (b) {
      *b = this->data.as16[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as16[index + 3] : this->max_value;
    }
  } else if (this->channel_width == 32) {
    if (r) {
      *r = this->data.as32[index];
    }
    if (g) {
      *g = this->data.as32[index + 1];
    }
    if (b) {
      *b = this->data.as32[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as32[index + 3] : this->max_value;
    }
  } else if (this->channel_width == 64) {
    if (r) {
      *r = this->data.as64[index];
    }
    if (g) {
      *g = this->data.as64[index + 1];
    }
    if (b) {
      *b = this->data.as64[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as64[index + 3] : this->max_value;
    }
  } else {
    throw logic_error("image channel width is not 8, 16, 32, or 64");
  }
}